

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  int *piVar1;
  ImGuiTextRange *pIVar2;
  char *pcVar3;
  ImGuiTextRange *pIVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  ImGuiTextRange input_range;
  ImGuiTextRange local_40;
  
  iVar8 = (this->Filters).Capacity;
  if (iVar8 < 0) {
    uVar7 = iVar8 / 2 + iVar8;
    uVar7 = ~((int)uVar7 >> 0x1f) & uVar7;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pIVar4 = (ImGuiTextRange *)(*GImAllocatorAllocFunc)((ulong)uVar7 << 4,GImAllocatorUserData);
    pIVar2 = (this->Filters).Data;
    if (pIVar2 != (ImGuiTextRange *)0x0) {
      memcpy(pIVar4,pIVar2,(long)(this->Filters).Size << 4);
      pIVar2 = (this->Filters).Data;
      if ((pIVar2 != (ImGuiTextRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (this->Filters).Data = pIVar4;
    (this->Filters).Capacity = uVar7;
  }
  (this->Filters).Size = 0;
  sVar5 = strlen(this->InputBuf);
  local_40.e = this->InputBuf + sVar5;
  local_40.b = this->InputBuf;
  ImGuiTextRange::split(&local_40,',',&this->Filters);
  this->CountGrep = 0;
  uVar6 = (ulong)(uint)(this->Filters).Size;
  if (uVar6 != 0) {
    iVar8 = this->CountGrep;
    pIVar2 = (this->Filters).Data;
    uVar9 = 0;
    do {
      pIVar4 = pIVar2 + uVar9;
      pcVar10 = pIVar2[uVar9].b;
      if (pcVar10 < pIVar2[uVar9].e) {
        do {
          if ((*pcVar10 != ' ') && (*pcVar10 != '\t')) break;
          pcVar10 = pcVar10 + 1;
          pIVar4->b = pcVar10;
        } while (pcVar10 != pIVar2[uVar9].e);
      }
      pcVar3 = pIVar4->e;
      while (pcVar10 < pcVar3) {
        pcVar11 = pcVar3 + -1;
        if ((*pcVar11 != ' ') && (*pcVar11 != '\t')) break;
        pIVar4->e = pcVar11;
        pcVar3 = pcVar11;
      }
      if ((pcVar10 != pcVar3) && (*pcVar10 != '-')) {
        iVar8 = iVar8 + 1;
        this->CountGrep = iVar8;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar6);
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    ImGuiTextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        ImGuiTextRange& f = Filters[i];
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (Filters[i].b[0] != '-')
            CountGrep += 1;
    }
}